

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void AddNonCompressedBlock
               (ZopfliOptions *options,int final,uchar *in,size_t instart,size_t inend,uchar *bp,
               uchar **out,size_t *outsize)

{
  long in_RCX;
  long in_RDX;
  ulong in_R8;
  undefined1 *in_R9;
  long *in_stack_00000008;
  ulong *in_stack_00000010;
  int currentfinal;
  unsigned_short nlen;
  unsigned_short blocksize;
  size_t i;
  size_t pos;
  size_t *in_stack_ffffffffffffff88;
  uchar **in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  void *local_58;
  ushort local_42;
  ulong local_40;
  long local_38;
  
  local_38 = in_RCX;
  while( true ) {
    local_42 = 0xffff;
    if (in_R8 < local_38 + 0xffffU) {
      local_42 = (short)in_R8 - (short)local_38;
    }
    AddBit((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98,
           in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    AddBit((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98,
           in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    AddBit((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98,
           in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    *in_R9 = 0;
    if ((*in_stack_00000010 & *in_stack_00000010 - 1) == 0) {
      if (*in_stack_00000010 == 0) {
        local_58 = malloc(1);
      }
      else {
        local_58 = realloc((void *)*in_stack_00000008,*in_stack_00000010 << 1);
      }
      *in_stack_00000008 = (long)local_58;
    }
    *(char *)(*in_stack_00000008 + *in_stack_00000010) = (char)((ulong)local_42 % 0x100);
    *in_stack_00000010 = *in_stack_00000010 + 1;
    if ((*in_stack_00000010 & *in_stack_00000010 - 1) == 0) {
      if (*in_stack_00000010 == 0) {
        in_stack_ffffffffffffffa0 = malloc(1);
      }
      else {
        in_stack_ffffffffffffffa0 = realloc((void *)*in_stack_00000008,*in_stack_00000010 << 1);
      }
      *in_stack_00000008 = (long)in_stack_ffffffffffffffa0;
    }
    *(char *)(*in_stack_00000008 + *in_stack_00000010) = (char)(((ulong)local_42 / 0x100) % 0x100);
    *in_stack_00000010 = *in_stack_00000010 + 1;
    if ((*in_stack_00000010 & *in_stack_00000010 - 1) == 0) {
      if (*in_stack_00000010 == 0) {
        in_stack_ffffffffffffff98 = (uchar *)malloc(1);
      }
      else {
        in_stack_ffffffffffffff98 =
             (uchar *)realloc((void *)*in_stack_00000008,*in_stack_00000010 << 1);
      }
      *in_stack_00000008 = (long)in_stack_ffffffffffffff98;
    }
    *(char *)(*in_stack_00000008 + *in_stack_00000010) = (char)((ulong)(local_42 ^ 0xffff) % 0x100);
    *in_stack_00000010 = *in_stack_00000010 + 1;
    if ((*in_stack_00000010 & *in_stack_00000010 - 1) == 0) {
      if (*in_stack_00000010 == 0) {
        in_stack_ffffffffffffff90 = (uchar **)malloc(1);
      }
      else {
        in_stack_ffffffffffffff90 =
             (uchar **)realloc((void *)*in_stack_00000008,*in_stack_00000010 << 1);
      }
      *in_stack_00000008 = (long)in_stack_ffffffffffffff90;
    }
    *(char *)(*in_stack_00000008 + *in_stack_00000010) =
         (char)(((ulong)(local_42 ^ 0xffff) / 0x100) % 0x100);
    *in_stack_00000010 = *in_stack_00000010 + 1;
    for (local_40 = 0; local_40 < local_42; local_40 = local_40 + 1) {
      if ((*in_stack_00000010 & *in_stack_00000010 - 1) == 0) {
        if (*in_stack_00000010 == 0) {
          in_stack_ffffffffffffff88 = (size_t *)malloc(1);
        }
        else {
          in_stack_ffffffffffffff88 =
               (size_t *)realloc((void *)*in_stack_00000008,*in_stack_00000010 << 1);
        }
        *in_stack_00000008 = (long)in_stack_ffffffffffffff88;
      }
      *(undefined1 *)(*in_stack_00000008 + *in_stack_00000010) =
           *(undefined1 *)(in_RDX + local_38 + local_40);
      *in_stack_00000010 = *in_stack_00000010 + 1;
    }
    if (in_R8 <= local_38 + (ulong)local_42) break;
    local_38 = (ulong)local_42 + local_38;
  }
  return;
}

Assistant:

static void AddNonCompressedBlock(const ZopfliOptions* options, int final,
                                  const unsigned char* in, size_t instart,
                                  size_t inend,
                                  unsigned char* bp,
                                  unsigned char** out, size_t* outsize) {
  size_t pos = instart;
  (void)options;
  for (;;) {
    size_t i;
    unsigned short blocksize = 65535;
    unsigned short nlen;
    int currentfinal;

    if (pos + blocksize > inend) blocksize = inend - pos;
    currentfinal = pos + blocksize >= inend;

    nlen = ~blocksize;

    AddBit(final && currentfinal, bp, out, outsize);
    /* BTYPE 00 */
    AddBit(0, bp, out, outsize);
    AddBit(0, bp, out, outsize);

    /* Any bits of input up to the next byte boundary are ignored. */
    *bp = 0;

    ZOPFLI_APPEND_DATA(blocksize % 256, out, outsize);
    ZOPFLI_APPEND_DATA((blocksize / 256) % 256, out, outsize);
    ZOPFLI_APPEND_DATA(nlen % 256, out, outsize);
    ZOPFLI_APPEND_DATA((nlen / 256) % 256, out, outsize);

    for (i = 0; i < blocksize; i++) {
      ZOPFLI_APPEND_DATA(in[pos + i], out, outsize);
    }

    if (currentfinal) break;
    pos += blocksize;
  }
}